

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

size_t __thiscall cnn::KMaxPooling::aux_storage_size(KMaxPooling *this)

{
  uint uVar1;
  
  uVar1 = Dim::size((Dim *)this);
  return (ulong)uVar1 << 2;
}

Assistant:

size_t KMaxPooling::aux_storage_size() const {
  // map of where the entries in f(x) go to entries in x
  return sizeof(int) * dim.size();
}